

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnRefFuncExpr(TypeChecker *this,Index func_type,bool force_generic_funcref)

{
  bool bVar1;
  Type local_30;
  Type local_28;
  byte local_1d;
  Index local_1c;
  bool force_generic_funcref_local;
  TypeChecker *pTStack_18;
  Index func_type_local;
  TypeChecker *this_local;
  
  local_1d = force_generic_funcref;
  local_1c = func_type;
  pTStack_18 = this;
  bVar1 = Features::function_references_enabled(&this->features_);
  if ((bVar1) && ((local_1d & 1) == 0)) {
    Type::Type(&local_28,Reference,local_1c);
    PushType(this,local_28);
  }
  else {
    Type::Type(&local_30,FuncRef);
    PushType(this,local_30);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnRefFuncExpr(Index func_type, bool force_generic_funcref) {
  /*
   * In a const expression, treat ref.func as producing a generic funcref.
   * This avoids having to implement funcref subtyping (for now) and matches
   * the previous behavior where SharedValidator::OnElemSegmentElemExpr_RefFunc
   * examined only the validity of the function index.
   */
  if (features_.function_references_enabled() && !force_generic_funcref) {
    PushType(Type(Type::Reference, func_type));
  } else {
    PushType(Type::FuncRef);
  }
  return Result::Ok;
}